

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive *prim;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [64];
  undefined4 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_2481;
  RayHit *local_2480;
  RayQueryContext *local_2478;
  ulong local_2470;
  ulong *local_2468;
  long local_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_2468 = local_2368;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl((undefined1  [16])aVar2,auVar19);
    auVar34._8_4_ = 0x219392ef;
    auVar34._0_8_ = 0x219392ef219392ef;
    auVar34._12_4_ = 0x219392ef;
    uVar15 = vcmpps_avx512vl(auVar19,auVar34,1);
    bVar3 = (bool)((byte)uVar15 & 1);
    auVar20._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
    bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
    bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
    bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
    auVar19 = vrcp14ps_avx512vl(auVar20);
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar21 = vfnmadd213ps_avx512vl(auVar20,auVar19,auVar21);
    local_2370[0] = 0;
    auVar20 = vfmadd132ps_fma(auVar21,auVar19,auVar19);
    fVar28 = auVar20._0_4_;
    local_2398._4_4_ = fVar28;
    local_2398._0_4_ = fVar28;
    local_2398._8_4_ = fVar28;
    local_2398._12_4_ = fVar28;
    local_2398._16_4_ = fVar28;
    local_2398._20_4_ = fVar28;
    local_2398._24_4_ = fVar28;
    local_2398._28_4_ = fVar28;
    auVar36 = ZEXT3264(local_2398);
    auVar19 = vmovshdup_avx(auVar20);
    uVar32 = auVar19._0_8_;
    local_23b8._8_8_ = uVar32;
    local_23b8._0_8_ = uVar32;
    local_23b8._16_8_ = uVar32;
    local_23b8._24_8_ = uVar32;
    auVar37 = ZEXT3264(local_23b8);
    auVar21 = vshufpd_avx(auVar20,auVar20,1);
    auVar35._8_4_ = 2;
    auVar35._0_8_ = 0x200000002;
    auVar35._12_4_ = 2;
    auVar35._16_4_ = 2;
    auVar35._20_4_ = 2;
    auVar35._24_4_ = 2;
    auVar35._28_4_ = 2;
    local_23d8 = vpermps_avx2(auVar35,ZEXT1632(auVar20));
    auVar38 = ZEXT3264(local_23d8);
    fVar29 = fVar28 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar22._8_4_ = 1;
    auVar22._0_8_ = 0x100000001;
    auVar22._12_4_ = 1;
    auVar22._16_4_ = 1;
    auVar22._20_4_ = 1;
    auVar22._24_4_ = 1;
    auVar22._28_4_ = 1;
    auVar23 = ZEXT1632(CONCAT412(auVar20._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar20._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar20._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar29))
                                ));
    auVar22 = vpermps_avx2(auVar22,auVar23);
    auVar23 = vpermps_avx2(auVar35,auVar23);
    uVar15 = (ulong)(fVar28 < 0.0) << 5;
    uVar18 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x40;
    uVar17 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x80;
    uVar14 = uVar15 ^ 0x20;
    uVar31 = auVar5._0_4_;
    auVar30 = ZEXT3264(CONCAT428(uVar31,CONCAT424(uVar31,CONCAT420(uVar31,CONCAT416(uVar31,CONCAT412
                                                  (uVar31,CONCAT48(uVar31,CONCAT44(uVar31,uVar31))))
                                                  ))));
    local_23f8._0_8_ = CONCAT44(fVar29,fVar29) ^ 0x8000000080000000;
    local_23f8._8_4_ = -fVar29;
    local_23f8._12_4_ = -fVar29;
    local_23f8._16_4_ = -fVar29;
    local_23f8._20_4_ = -fVar29;
    local_23f8._24_4_ = -fVar29;
    local_23f8._28_4_ = -fVar29;
    auVar39 = ZEXT3264(local_23f8);
    local_2418._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
    local_2418._8_4_ = auVar22._8_4_ ^ 0x80000000;
    local_2418._12_4_ = auVar22._12_4_ ^ 0x80000000;
    local_2418._16_4_ = auVar22._16_4_ ^ 0x80000000;
    local_2418._20_4_ = auVar22._20_4_ ^ 0x80000000;
    local_2418._24_4_ = auVar22._24_4_ ^ 0x80000000;
    local_2418._28_4_ = auVar22._28_4_ ^ 0x80000000;
    auVar40 = ZEXT3264(local_2418);
    local_2438._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
    local_2438._8_4_ = auVar23._8_4_ ^ 0x80000000;
    local_2438._12_4_ = auVar23._12_4_ ^ 0x80000000;
    local_2438._16_4_ = auVar23._16_4_ ^ 0x80000000;
    local_2438._20_4_ = auVar23._20_4_ ^ 0x80000000;
    local_2438._24_4_ = auVar23._24_4_ ^ 0x80000000;
    local_2438._28_4_ = auVar23._28_4_ ^ 0x80000000;
    auVar41 = ZEXT3264(local_2438);
    local_2458 = vbroadcastss_avx512vl(auVar4);
    auVar42 = ZEXT3264(local_2458);
    auVar22 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar43 = ZEXT3264(auVar22);
    auVar22 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar44 = ZEXT3264(auVar22);
    local_2480 = ray;
    local_2478 = context;
    local_2470 = uVar15;
    do {
      pfVar1 = (float *)(local_2468 + -1);
      local_2468 = local_2468 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar16 = *local_2468;
        while ((uVar16 & 8) == 0) {
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar15),auVar39._0_32_,
                                   auVar36._0_32_);
          auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar18),auVar40._0_32_,
                                   auVar37._0_32_);
          auVar22 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar5));
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar17),auVar41._0_32_,
                                   auVar38._0_32_);
          auVar23 = vpmaxsd_avx512vl(ZEXT1632(auVar4),auVar42._0_32_);
          auVar22 = vpmaxsd_avx2(auVar22,auVar23);
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar14),auVar39._0_32_,
                                   auVar36._0_32_);
          auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar18 ^ 0x20)),
                                   auVar40._0_32_,auVar37._0_32_);
          auVar23 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar5));
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar17 ^ 0x20)),
                                   auVar41._0_32_,auVar38._0_32_);
          auVar35 = vpminsd_avx2(ZEXT1632(auVar4),auVar30._0_32_);
          auVar23 = vpminsd_avx2(auVar23,auVar35);
          uVar9 = vpcmpd_avx512vl(auVar22,auVar23,2);
          bVar11 = (byte)uVar9;
          if (bVar11 == 0) goto LAB_01f340ae;
          auVar23 = *(undefined1 (*) [32])(uVar16 & 0xfffffffffffffff0);
          auVar35 = ((undefined1 (*) [32])(uVar16 & 0xfffffffffffffff0))[1];
          auVar24 = vmovdqa64_avx512vl(auVar43._0_32_);
          auVar24 = vpternlogd_avx512vl(auVar24,auVar22,auVar44._0_32_,0xf8);
          auVar25 = vpcompressd_avx512vl(auVar24);
          auVar26._0_4_ =
               (uint)(bVar11 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar24._0_4_;
          bVar3 = (bool)((byte)(uVar9 >> 1) & 1);
          auVar26._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar24._4_4_;
          bVar3 = (bool)((byte)(uVar9 >> 2) & 1);
          auVar26._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar24._8_4_;
          bVar3 = (bool)((byte)(uVar9 >> 3) & 1);
          auVar26._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar24._12_4_;
          bVar3 = (bool)((byte)(uVar9 >> 4) & 1);
          auVar26._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar24._16_4_;
          bVar3 = (bool)((byte)(uVar9 >> 5) & 1);
          auVar26._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar24._20_4_;
          bVar3 = (bool)((byte)(uVar9 >> 6) & 1);
          auVar26._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar24._24_4_;
          bVar3 = SUB81(uVar9 >> 7,0);
          auVar26._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar24._28_4_;
          auVar24 = vpermt2q_avx512vl(auVar23,auVar26,auVar35);
          uVar16 = auVar24._0_8_;
          bVar11 = bVar11 - 1 & bVar11;
          if (bVar11 != 0) {
            auVar24 = vpshufd_avx2(auVar26,0x55);
            vpermt2q_avx512vl(auVar23,auVar24,auVar35);
            auVar25 = vpminsd_avx2(auVar26,auVar24);
            auVar24 = vpmaxsd_avx2(auVar26,auVar24);
            bVar11 = bVar11 - 1 & bVar11;
            if (bVar11 == 0) {
              auVar26 = vpermi2q_avx512vl(auVar25,auVar23,auVar35);
              uVar16 = auVar26._0_8_;
              auVar23 = vpermt2q_avx512vl(auVar23,auVar24,auVar35);
              *local_2468 = auVar23._0_8_;
              auVar22 = vpermd_avx2(auVar24,auVar22);
              *(int *)(local_2468 + 1) = auVar22._0_4_;
              local_2468 = local_2468 + 2;
            }
            else {
              auVar8 = vpshufd_avx2(auVar26,0xaa);
              vpermt2q_avx512vl(auVar23,auVar8,auVar35);
              auVar6 = vpminsd_avx2(auVar25,auVar8);
              auVar25 = vpmaxsd_avx2(auVar25,auVar8);
              auVar8 = vpminsd_avx2(auVar24,auVar25);
              auVar24 = vpmaxsd_avx2(auVar24,auVar25);
              bVar11 = bVar11 - 1 & bVar11;
              if (bVar11 == 0) {
                auVar26 = vpermi2q_avx512vl(auVar6,auVar23,auVar35);
                uVar16 = auVar26._0_8_;
                auVar26 = vpermt2q_avx512vl(auVar23,auVar24,auVar35);
                *local_2468 = auVar26._0_8_;
                auVar24 = vpermd_avx2(auVar24,auVar22);
                *(int *)(local_2468 + 1) = auVar24._0_4_;
                auVar23 = vpermt2q_avx512vl(auVar23,auVar8,auVar35);
                local_2468[2] = auVar23._0_8_;
                auVar22 = vpermd_avx2(auVar8,auVar22);
                *(int *)(local_2468 + 3) = auVar22._0_4_;
                local_2468 = local_2468 + 4;
              }
              else {
                auVar25 = vpshufd_avx2(auVar26,0xff);
                vpermt2q_avx512vl(auVar23,auVar25,auVar35);
                auVar7 = vpminsd_avx2(auVar6,auVar25);
                auVar25 = vpmaxsd_avx2(auVar6,auVar25);
                auVar6 = vpminsd_avx2(auVar8,auVar25);
                auVar25 = vpmaxsd_avx2(auVar8,auVar25);
                auVar8 = vpminsd_avx2(auVar24,auVar25);
                auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                bVar11 = bVar11 - 1 & bVar11;
                if (bVar11 == 0) {
                  auVar26 = vpermi2q_avx512vl(auVar7,auVar23,auVar35);
                  uVar16 = auVar26._0_8_;
                  auVar26 = vpermt2q_avx512vl(auVar23,auVar24,auVar35);
                  *local_2468 = auVar26._0_8_;
                  auVar24 = vpermd_avx2(auVar24,auVar22);
                  *(int *)(local_2468 + 1) = auVar24._0_4_;
                  auVar24 = vpermt2q_avx512vl(auVar23,auVar8,auVar35);
                  local_2468[2] = auVar24._0_8_;
                  auVar24 = vpermd_avx2(auVar8,auVar22);
                  *(int *)(local_2468 + 3) = auVar24._0_4_;
                  auVar23 = vpermt2q_avx512vl(auVar23,auVar6,auVar35);
                  local_2468[4] = auVar23._0_8_;
                  auVar22 = vpermd_avx2(auVar6,auVar22);
                  *(int *)(local_2468 + 5) = auVar22._0_4_;
                  local_2468 = local_2468 + 6;
                }
                else {
                  auVar27 = valignd_avx512vl(auVar26,auVar26,3);
                  auVar26 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar25 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar26,auVar7);
                  auVar26 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar25 = vpermt2d_avx512vl(auVar25,auVar26,auVar6);
                  auVar25 = vpermt2d_avx512vl(auVar25,auVar26,auVar8);
                  auVar26 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar24 = vpermt2d_avx512vl(auVar25,auVar26,auVar24);
                  auVar33 = ZEXT3264(auVar24);
                  bVar13 = bVar11;
                  do {
                    auVar26 = auVar33._0_32_;
                    auVar24._8_4_ = 1;
                    auVar24._0_8_ = 0x100000001;
                    auVar24._12_4_ = 1;
                    auVar24._16_4_ = 1;
                    auVar24._20_4_ = 1;
                    auVar24._24_4_ = 1;
                    auVar24._28_4_ = 1;
                    auVar24 = vpermd_avx2(auVar24,auVar27);
                    auVar27 = valignd_avx512vl(auVar27,auVar27,1);
                    vpermt2q_avx512vl(auVar23,auVar27,auVar35);
                    bVar13 = bVar13 - 1 & bVar13;
                    uVar32 = vpcmpd_avx512vl(auVar24,auVar26,5);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar26);
                    bVar10 = (byte)uVar32 << 1;
                    auVar26 = valignd_avx512vl(auVar26,auVar26,7);
                    bVar3 = (bool)((byte)uVar32 & 1);
                    auVar25._4_4_ = (uint)bVar3 * auVar26._4_4_ | (uint)!bVar3 * auVar24._4_4_;
                    auVar25._0_4_ = auVar24._0_4_;
                    bVar3 = (bool)(bVar10 >> 2 & 1);
                    auVar25._8_4_ = (uint)bVar3 * auVar26._8_4_ | (uint)!bVar3 * auVar24._8_4_;
                    bVar3 = (bool)(bVar10 >> 3 & 1);
                    auVar25._12_4_ = (uint)bVar3 * auVar26._12_4_ | (uint)!bVar3 * auVar24._12_4_;
                    bVar3 = (bool)(bVar10 >> 4 & 1);
                    auVar25._16_4_ = (uint)bVar3 * auVar26._16_4_ | (uint)!bVar3 * auVar24._16_4_;
                    bVar3 = (bool)(bVar10 >> 5 & 1);
                    auVar25._20_4_ = (uint)bVar3 * auVar26._20_4_ | (uint)!bVar3 * auVar24._20_4_;
                    bVar3 = (bool)(bVar10 >> 6 & 1);
                    auVar25._24_4_ = (uint)bVar3 * auVar26._24_4_ | (uint)!bVar3 * auVar24._24_4_;
                    auVar25._28_4_ =
                         (uint)(bVar10 >> 7) * auVar26._28_4_ |
                         (uint)!(bool)(bVar10 >> 7) * auVar24._28_4_;
                    auVar33 = ZEXT3264(auVar25);
                  } while (bVar13 != 0);
                  lVar12 = (ulong)(uint)POPCOUNT((uint)bVar11) + 3;
                  do {
                    auVar24 = vpermi2q_avx512vl(auVar25,auVar23,auVar35);
                    *local_2468 = auVar24._0_8_;
                    auVar26 = auVar33._0_32_;
                    auVar24 = vpermd_avx2(auVar26,auVar22);
                    *(int *)(local_2468 + 1) = auVar24._0_4_;
                    auVar25 = valignd_avx512vl(auVar26,auVar26,1);
                    local_2468 = local_2468 + 2;
                    auVar33 = ZEXT3264(auVar25);
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                  auVar22 = vpermt2q_avx512vl(auVar23,auVar25,auVar35);
                  uVar16 = auVar22._0_8_;
                }
              }
            }
          }
        }
        local_2460 = (ulong)((uint)uVar16 & 0xf) - 8;
        if (local_2460 != 0) {
          prim = (Primitive *)(uVar16 & 0xfffffffffffffff0);
          do {
            InstanceArrayIntersector1::intersect(&local_2481,local_2480,local_2478,prim);
            prim = prim + 1;
            local_2460 = local_2460 + -1;
            ray = local_2480;
          } while (local_2460 != 0);
        }
        fVar28 = (ray->super_RayK<1>).tfar;
        auVar30 = ZEXT3264(CONCAT428(fVar28,CONCAT424(fVar28,CONCAT420(fVar28,CONCAT416(fVar28,
                                                  CONCAT412(fVar28,CONCAT48(fVar28,CONCAT44(fVar28,
                                                  fVar28))))))));
        auVar36 = ZEXT3264(local_2398);
        auVar37 = ZEXT3264(local_23b8);
        auVar38 = ZEXT3264(local_23d8);
        auVar39 = ZEXT3264(local_23f8);
        auVar40 = ZEXT3264(local_2418);
        auVar41 = ZEXT3264(local_2438);
        auVar42 = ZEXT3264(local_2458);
        auVar22 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar43 = ZEXT3264(auVar22);
        auVar22 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar44 = ZEXT3264(auVar22);
        uVar15 = local_2470;
      }
LAB_01f340ae:
    } while (local_2468 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }